

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O3

wchar_t rd_gear_aux(rd_item_t rd_item_version,object **gear)

{
  wchar_t *pwVar1;
  object *poVar2;
  object **ppoVar3;
  object *poVar4;
  uint8_t code;
  byte local_29;
  
  rd_byte(&local_29);
  if (local_29 != 0xff) {
    poVar4 = (object *)0x0;
    do {
      poVar2 = rd_item();
      if (poVar2 == (object *)0x0) {
        note("Error reading item");
        return L'\xffffffff';
      }
      poVar2->prev = poVar4;
      ppoVar3 = &poVar4->next;
      if (poVar4 == (object *)0x0) {
        ppoVar3 = (object **)rd_item_version;
      }
      *ppoVar3 = poVar2;
      if ((ushort)local_29 < (player->body).count) {
        (player->body).slots[local_29].obj = poVar2;
        pwVar1 = &player->upkeep->equip_cnt;
        *pwVar1 = *pwVar1 + L'\x01';
      }
      rd_byte(&local_29);
      poVar4 = poVar2;
    } while (local_29 != 0xff);
  }
  return L'\0';
}

Assistant:

static int rd_gear_aux(rd_item_t rd_item_version, struct object **gear)
{
	uint8_t code;
	struct object *last_gear_obj = NULL;

	/* Get the first item code */
	rd_byte(&code);

	/* Read until done */
	while (code != FINISHED_CODE) {
		struct object *obj = (*rd_item_version)();

		/* Read the item */
		if (!obj) {
			note("Error reading item");
			return (-1);
		}

		/* Append the object */
		obj->prev = last_gear_obj;
		if (last_gear_obj)
			last_gear_obj->next = obj;
		else
			*gear = obj;
		last_gear_obj = obj;

		/* If it's equipment, wield it */
		if (code < player->body.count) {
			player->body.slots[code].obj = obj;
			player->upkeep->equip_cnt++;
		}

		/* Get the next item code */
		rd_byte(&code);
	}

	/* Success */
	return (0);
}